

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall gimage::Histogram::setSize(Histogram *this,int width,int height,int binsize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int k;
  int local_18;
  
  if ((*in_RDI != in_ESI) || (in_RDI[1] != in_EDX)) {
    if (*(void **)(in_RDI + 4) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 4));
    }
    if (*(void **)(in_RDI + 6) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 6));
    }
    *in_RDI = in_ESI;
    in_RDI[1] = in_EDX;
    in_RDI[4] = 0;
    in_RDI[5] = 0;
    in_RDI[6] = 0;
    in_RDI[7] = 0;
    if ((0 < *in_RDI) && (0 < in_RDI[1])) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(*in_RDI * in_RDI[1]);
      uVar3 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pvVar4 = operator_new__(uVar3);
      *(void **)(in_RDI + 4) = pvVar4;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)in_RDI[1];
      uVar3 = SUB168(auVar2 * ZEXT816(8),0);
      if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pvVar4 = operator_new__(uVar3);
      *(void **)(in_RDI + 6) = pvVar4;
      **(undefined8 **)(in_RDI + 6) = *(undefined8 *)(in_RDI + 4);
      for (local_18 = 1; local_18 < in_RDI[1]; local_18 = local_18 + 1) {
        *(long *)(*(long *)(in_RDI + 6) + (long)local_18 * 8) =
             *(long *)(*(long *)(in_RDI + 6) + (long)(local_18 + -1) * 8) + (long)*in_RDI * 8;
      }
    }
  }
  in_RDI[2] = in_ECX;
  return;
}

Assistant:

void Histogram::setSize(int width, int height, int binsize)
{
  if (w != width || h != height)
  {
    delete [] val;
    delete [] row;

    w=width;
    h=height;
    val=0;
    row=0;

    if (w > 0 && h > 0)
    {
      val=new unsigned long [w*h];
      row=new unsigned long * [h];

      row[0]=val;

      for (int k=1; k<h; k++)
      {
        row[k]=row[k-1]+w;
      }
    }
  }

  bs=binsize;
}